

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O0

void __thiscall
wasm::WATParser::WithPosition<wasm::WATParser::ParseModuleTypesCtx>::WithPosition
          (WithPosition<wasm::WATParser::ParseModuleTypesCtx> *this,ParseModuleTypesCtx *ctx,
          Index pos)

{
  size_t sVar1;
  Index pos_local;
  ParseModuleTypesCtx *ctx_local;
  WithPosition<wasm::WATParser::ParseModuleTypesCtx> *this_local;
  
  this->ctx = ctx;
  sVar1 = Lexer::getPos(&ctx->in);
  this->original = (Index)sVar1;
  Lexer::takeAnnotations(&this->annotations,&ctx->in);
  Lexer::setPos(&ctx->in,(ulong)pos);
  return;
}

Assistant:

WithPosition(Ctx& ctx, Index pos)
    : ctx(ctx), original(ctx.in.getPos()),
      annotations(ctx.in.takeAnnotations()) {
    ctx.in.setPos(pos);
  }